

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_parser.cpp
# Opt level: O0

Configuration ParseCmdArgs(int argc,char **argv,int *argc_flags_offset_out)

{
  int *in_RDX;
  int in_EDI;
  string flag;
  int offset;
  Configuration config;
  char *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  int local_58;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  Configuration local_4;
  
  local_1c = 1;
  Configuration::Configuration(&local_4);
  do {
    if (in_EDI <= local_1c) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator(&local_41);
    in_stack_ffffffffffffff97 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(in_stack_ffffffffffffff95,
                                                    CONCAT14(in_stack_ffffffffffffff94,
                                                             CONCAT13(in_stack_ffffffffffffff93,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                         in_stack_ffffffffffffff88);
    if (((bool)in_stack_ffffffffffffff97) ||
       (in_stack_ffffffffffffff96 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,
                                               CONCAT15(in_stack_ffffffffffffff95,
                                                        CONCAT14(in_stack_ffffffffffffff94,
                                                                 CONCAT13(in_stack_ffffffffffffff93,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                             in_stack_ffffffffffffff88), (bool)in_stack_ffffffffffffff96)) {
      local_4.printUsage = true;
      local_1c = local_1c + 1;
      local_58 = 2;
    }
    else {
      in_stack_ffffffffffffff95 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffff97,
                                    CONCAT16(in_stack_ffffffffffffff96,
                                             CONCAT15(in_stack_ffffffffffffff95,
                                                      CONCAT14(in_stack_ffffffffffffff94,
                                                               CONCAT13(in_stack_ffffffffffffff93,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                           in_stack_ffffffffffffff88);
      if (((bool)in_stack_ffffffffffffff95) ||
         (in_stack_ffffffffffffff94 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                          CONCAT14(in_stack_ffffffffffffff94,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                               ,in_stack_ffffffffffffff88), (bool)in_stack_ffffffffffffff94)) {
        local_4.silent = true;
        local_1c = local_1c + 1;
        local_58 = 2;
      }
      else {
        in_stack_ffffffffffffff93 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,
                                               CONCAT15(in_stack_ffffffffffffff95,
                                                        CONCAT14(in_stack_ffffffffffffff94,
                                                                 CONCAT13(in_stack_ffffffffffffff93,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                             in_stack_ffffffffffffff88);
        if (((bool)in_stack_ffffffffffffff93) ||
           (in_stack_ffffffffffffff92 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffff97,
                                             CONCAT16(in_stack_ffffffffffffff96,
                                                      CONCAT15(in_stack_ffffffffffffff95,
                                                               CONCAT14(in_stack_ffffffffffffff94,
                                                                        CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                                 ,in_stack_ffffffffffffff88), (bool)in_stack_ffffffffffffff92)) {
          local_4.measurePerformance = true;
          local_1c = local_1c + 1;
          local_58 = 2;
        }
        else {
          in_stack_ffffffffffffff91 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                          CONCAT14(in_stack_ffffffffffffff94,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                               ,in_stack_ffffffffffffff88);
          if (((bool)in_stack_ffffffffffffff91) ||
             (in_stack_ffffffffffffff90 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffff97,
                                               CONCAT16(in_stack_ffffffffffffff96,
                                                        CONCAT15(in_stack_ffffffffffffff95,
                                                                 CONCAT14(in_stack_ffffffffffffff94,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                                   ,in_stack_ffffffffffffff88), (bool)in_stack_ffffffffffffff90)) {
            local_4.interactive = true;
            local_1c = local_1c + 1;
            local_58 = 2;
          }
          else {
            local_58 = 3;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  } while (local_58 == 2);
  if ((in_EDI == local_1c) && (((uint)local_4 & 0x1000000) == 0)) {
    local_4.printUsage = true;
  }
  if (((uint)local_4 & 1) != 0) {
    PrintUsage();
  }
  *in_RDX = local_1c;
  return local_4;
}

Assistant:

Configuration ParseCmdArgs(int argc, char **argv, int &argc_flags_offset_out) {
    //executable name should be skipped
    int offset = 1;
    
    Configuration config;
    
    while (offset < argc) {
        std::string flag(argv[offset]);
        if (flag == "--help" || flag == "-h") {
            config.printUsage = true;
            ++offset;
            continue;
        }
        if (flag == "--silent" || flag == "-s") {
            config.silent = true;
            ++offset;
            continue;
        }
        if (flag == "--perf" || flag == "-p") {
            config.measurePerformance = true;
            ++offset;
            continue;
        }
        if (flag == "--interactive" || flag == "-i") {
            config.interactive = true;
            ++offset;
            continue;
        }
        break;
    }
    //usage should be printed when we don't know what to process
    if (argc == offset && !config.interactive) {
        config.printUsage = true;
    }
    if (config.printUsage) PrintUsage();
    
    argc_flags_offset_out = offset;
    return config;
}